

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-iosim.c
# Opt level: O2

void info(char *fmt,...)

{
  long lVar1;
  char in_AL;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  double dVar3;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_f0;
  char local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  va_list va;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  uStack_f0 = 0x104126;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  MPI_Barrier(&ompi_mpi_comm_world);
  if (info::t0 < 0.0) {
    uStack_f0 = 0x104139;
    info::t0 = (double)MPI_Wtime();
  }
  uStack_f0 = 0x104149;
  sVar2 = strlen(fmt);
  lVar1 = -(sVar2 + 0x73 & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x10415f;
  dVar3 = (double)MPI_Wtime();
  *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x10417b;
  sprintf(local_e8 + lVar1,"[%010.3f] %s",dVar3 - info::t0,fmt);
  if (ThisTask == 0) {
    va[0].overflow_arg_area = local_e8;
    va[0]._0_8_ = &stack0x00000008;
    local_38 = 0x3000000008;
    *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1041b0;
    vprintf(local_e8 + lVar1,&local_38);
  }
  return;
}

Assistant:

static void 
info(char * fmt, ...) {

    static double t0 = -1.0;

    MPI_Barrier(MPI_COMM_WORLD);

    if(t0 < 0) t0 = MPI_Wtime();

    char * buf = alloca(strlen(fmt) + 100);
    sprintf(buf, "[%010.3f] %s", MPI_Wtime() - t0, fmt );

    if(ThisTask == 0) {
        va_list va;
        va_start(va, fmt);
        vprintf(buf, va);
        va_end(va);
    }
}